

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime_abi_cxx11_
          (result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  local_date lVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  syntax_error *this_00;
  internal_error *piVar12;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  const_iterator cVar13;
  location *extraout_RDX;
  location *extraout_RDX_00;
  location *extraout_RDX_01;
  location *loc_00;
  ushort uVar14;
  EVP_PKEY_CTX *ctx;
  ushort uVar15;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  string str;
  result<toml::detail::region,_toml::detail::none_t> ofs;
  location inner_loc;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_349;
  string local_348;
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  region local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  undefined1 local_258 [80];
  undefined8 local_208;
  undefined1 auStack_200 [8];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [24];
  const_iterator cStack_1b8;
  location local_1b0;
  string local_168;
  undefined1 local_148 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  cVar13._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>,_toml::detail::either<toml::detail::character<'T'>,_toml::detail::character<'t'>,_toml::detail::character<'_'>_>,_toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'.'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::at_least<1UL>_>_>_>_>,_toml::detail::either<toml::detail::character<'Z'>,_toml::detail::character<'z'>,_toml::detail::sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>_>_>_>
  ::invoke(&local_78,(location *)this);
  if (local_78.is_ok_ == true) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar10 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)&local_2e8,(detail *)(pvVar10->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar10->last_)._M_current,in_RCX);
    location::location(&local_1b0,&local_168,(string *)&local_2e8);
    loc_00 = extraout_RDX;
    if ((region *)local_2e8._M_allocated_capacity != &local_2d8) {
      operator_delete((void *)local_2e8._M_allocated_capacity,
                      (long)local_2d8.super_region_base._vptr_region_base + 1);
      loc_00 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      loc_00 = extraout_RDX_01;
    }
    parse_local_datetime_abi_cxx11_(&local_d8,(detail *)&local_1b0,loc_00);
    if ((local_d8.is_ok_ != true) ||
       (local_1b0.iter_._M_current ==
        ((local_1b0.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish)) {
      piVar12 = (internal_error *)__cxa_allocate_exception(0x78);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"toml::parse_offset_datetime: invalid datetime format","");
      source_location::source_location((source_location *)&local_208,&local_1b0);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2e8,(source_location *)&local_208,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_2e8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_328,__l_00,(allocator_type *)&local_278);
      local_308._0_8_ = (pointer)0x0;
      local_308._8_8_ = (pointer)0x0;
      local_308._16_8_ = (pointer)0x0;
      format_underline((string *)local_148,&local_348,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_328,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_308,false);
      source_location::source_location((source_location *)local_258,&local_1b0);
      internal_error::internal_error(piVar12,(string *)local_148,(source_location *)local_258);
      __cxa_throw(piVar12,&internal_error::typeinfo,internal_error::~internal_error);
    }
    cVar13._M_current = local_1b0.iter_._M_current;
    sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&local_208,&local_1b0);
    if ((bool)(byte)local_208 == true) {
      pvVar10 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                          ((result<toml::detail::region,_toml::detail::none_t> *)&local_208);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                (&local_348,(detail *)(pvVar10->first_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (pvVar10->last_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 cVar13._M_current);
      std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_348);
      uVar8 = from_string<int>((string *)&local_2e8,0);
      if ((region *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,
                        (long)local_2d8.super_region_base._vptr_region_base + 1);
      }
      std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_348);
      uVar9 = from_string<int>((string *)&local_2e8,0);
      if ((region *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,
                        (long)local_2d8.super_region_base._vptr_region_base + 1);
      }
      if ((0x17 < uVar8) || (0x3b < uVar9)) {
        this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
        local_308._0_8_ = local_308 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_308,
                   "toml::parse_offset_datetime: invalid offset: it does not conform RFC3339.","");
        source_location::source_location((source_location *)local_258,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[78],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2e8,(source_location *)local_258,
                   (char (*) [78])
                   "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_2e8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_278,__l_01,&local_349);
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)local_328,(string *)local_308,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_278,&local_f8,false);
        source_location::source_location((source_location *)local_148,&local_1b0);
        syntax_error::syntax_error(this_00,(string *)local_328,(source_location *)local_148);
        __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      uVar3 = -uVar9;
      uVar4 = -uVar8;
      if (*local_348._M_dataplus._M_p == '+') {
        uVar3 = uVar9;
        uVar4 = uVar8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      uVar15 = (ushort)(uVar3 << 8);
      uVar14 = (ushort)uVar4 & 0xff;
    }
    else {
      if ((byte)(*local_1b0.iter_._M_current | 0x20U) != 0x7a) {
        piVar12 = (internal_error *)__cxa_allocate_exception(0x78);
        local_328._0_8_ = local_328 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,"toml::parse_offset_datetime: invalid datetime format","");
        source_location::source_location((source_location *)local_258,&local_1b0);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[26],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2e8,(source_location *)local_258,
                   (char (*) [26])"should be `Z` or `+HH:MM`");
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&local_2e8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_308,__l_02,(allocator_type *)&local_f8);
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_348,(string *)local_328,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_308,&local_278,false);
        source_location::source_location((source_location *)local_148,&local_1b0);
        internal_error::internal_error(piVar12,&local_348,(source_location *)local_148);
        __cxa_throw(piVar12,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar14 = 0;
      uVar15 = 0;
    }
    if (((byte)local_208 & 1) != 0) {
      region::~region((region *)auStack_200);
    }
    pvVar11 = result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap(&local_d8);
    lVar2 = (pvVar11->first).date;
    local_258._8_2_ = (pvVar11->first).time.nanosecond;
    local_258._0_8_ = *(undefined8 *)&(pvVar11->first).time;
    pvVar10 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    auStack_200._6_2_ = uVar14 | uVar15;
    local_208._4_4_ = (uint_least32_t)local_258._0_8_;
    auStack_200._0_4_ = SUB84(local_258._0_8_,4);
    auStack_200._4_2_ = local_258._8_2_;
    local_208._0_4_ = lVar2;
    region::region((region *)local_1f8,pvVar10);
    uVar7 = local_1f8._32_8_;
    uVar6 = local_1f8._16_8_;
    uVar5 = local_1f8._8_8_;
    local_2e8._M_allocated_capacity = CONCAT44(local_208._4_4_,local_208._0_4_);
    local_2e8._8_8_ = CONCAT26(auStack_200._6_2_,CONCAT24(auStack_200._4_2_,auStack_200._0_4_));
    local_2d8.source_name_._M_dataplus._M_p = (pointer)&local_2d8.source_name_.field_2;
    local_2d8.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001a47c0;
    local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._16_8_ = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._24_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
      local_2d8.source_name_.field_2._8_8_ = local_1d0._8_8_;
      local_1f8._24_8_ = local_2d8.source_name_._M_dataplus._M_p;
    }
    local_2d8.source_name_.field_2._M_allocated_capacity._1_7_ = local_1d0._1_7_;
    local_2d8.source_name_.field_2._M_local_buf[0] = local_1d0[0];
    local_1f8._32_8_ = 0;
    local_1d0[0] = '\0';
    local_2d8.first_._M_current = (char *)local_1d0._16_8_;
    local_2d8.last_._M_current = cStack_1b8._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p =
         (pointer)CONCAT44(local_208._4_4_,local_208._0_4_);
    (__return_storage_ptr__->field_1).fail.value._M_string_length =
         CONCAT26(auStack_200._6_2_,CONCAT24(auStack_200._4_2_,auStack_200._0_4_));
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         (size_type)&PTR__region_001a47c0;
    local_2d8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    local_2d8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    ctx = (EVP_PKEY_CTX *)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
    *(EVP_PKEY_CTX **)((long)&__return_storage_ptr__->field_1 + 0x28) = ctx;
    if ((pointer)local_1f8._24_8_ == local_2d8.source_name_._M_dataplus._M_p) {
      *(size_type *)ctx = local_2d8.source_name_.field_2._M_allocated_capacity;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x40) =
           local_2d8.source_name_.field_2._8_8_;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_1f8._24_8_;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x38) =
           local_2d8.source_name_.field_2._M_allocated_capacity;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar7;
    local_2d8.source_name_._M_string_length = 0;
    local_2d8.source_name_.field_2._M_allocated_capacity = (ulong)(uint7)local_1d0._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = (char *)local_1d0._16_8_
    ;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = cStack_1b8._M_current;
    local_1f8._24_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1d0;
    region::~region(&local_2d8);
    region::~region((region *)local_1f8);
    result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&local_d8,ctx);
    location::~location(&local_1b0);
  }
  else {
    location::reset((location *)this,cVar13);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"toml::parse_offset_datetime: ","");
    source_location::source_location((source_location *)&local_d8,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[40],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_2e8,(source_location *)&local_d8,
               (char (*) [40])"the next token is not a offset_datetime");
    __l._M_len = 1;
    __l._M_array = (iterator)&local_2e8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1b0,__l,(allocator_type *)local_328);
    local_348._M_dataplus._M_p = (char *)0x0;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity = 0;
    format_underline((string *)local_258,(string *)local_148,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_1b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_348,false);
    uVar5 = local_258._8_8_;
    local_208 = local_1f8;
    if ((undefined1 *)local_258._0_8_ == local_258 + 0x10) {
      local_1f8._8_8_ = local_258._24_8_;
      local_258._0_8_ = local_208;
    }
    local_1f8._1_7_ = local_258._17_7_;
    local_1f8[0] = local_258[0x10];
    local_258._8_8_ = 0;
    local_258[0x10] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((pointer)local_258._0_8_ == local_208) {
      paVar1->_M_allocated_capacity = local_1f8._0_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_;
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->field_1 = local_258._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_1f8._0_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = uVar5;
    auStack_200._0_4_ = 0;
    auStack_200._4_2_ = 0;
    auStack_200._6_2_ = 0;
    local_1f8._0_8_ = (ulong)(uint7)local_258._17_7_ << 8;
    local_258._0_8_ = local_258 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_348);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.last_._M_current != &local_288) {
      operator_delete(local_2d8.last_._M_current,local_288._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)&local_2e8);
    source_location::~source_location((source_location *)&local_d8);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
  }
  if (local_78.is_ok_ == true) {
    region::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<offset_datetime, region>, std::string>
parse_offset_datetime(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "date, not datetime"}}),
                source_location(inner_loc));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();

            const auto hour   = from_string<int>(str.substr(1,2), 0);
            const auto minute = from_string<int>(str.substr(4,2), 0);

            if((hour < 0 || 23 < hour) || (minute < 0 || 59 < minute))
            {
                throw syntax_error(format_underline("toml::parse_offset_datetime: "
                    "invalid offset: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }

            if(str.front() == '+')
            {
                offset = time_offset(hour, minute);
            }
            else
            {
                offset = time_offset(-hour, -minute);
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "should be `Z` or `+HH:MM`"}}),
                source_location(inner_loc));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_offset_datetime: ",
            {{source_location(loc), "the next token is not a offset_datetime"}}));
    }
}